

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O3

void vkt::tessellation::getClampedRoundedQuadTessLevels
               (SpacingMode spacingMode,float *innerSrc,float *outerSrc,int *innerDst,int *outerDst)

{
  int iVar1;
  int i;
  long lVar2;
  
  iVar1 = getClampedRoundedTessLevel(spacingMode,*innerSrc);
  *innerDst = iVar1;
  iVar1 = getClampedRoundedTessLevel(spacingMode,innerSrc[1]);
  innerDst[1] = iVar1;
  lVar2 = 0;
  do {
    iVar1 = getClampedRoundedTessLevel(spacingMode,outerSrc[lVar2]);
    outerDst[lVar2] = iVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  return;
}

Assistant:

void getClampedRoundedQuadTessLevels (const SpacingMode spacingMode,
									  const float*		innerSrc,
									  const float*		outerSrc,
									  int*				innerDst,
									  int*				outerDst)
{
	for (int i = 0; i < 2; i++)
		innerDst[i] = getClampedRoundedTessLevel(spacingMode, innerSrc[i]);
	for (int i = 0; i < 4; i++)
		outerDst[i] = getClampedRoundedTessLevel(spacingMode, outerSrc[i]);
}